

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testCurrentProgPriority
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  CallLogWrapper *this_00;
  Random *rnd;
  GLuint pipeline;
  TestLog *pTVar1;
  undefined8 uVar2;
  bool condition;
  deUint32 seed;
  GLuint GVar3;
  Surface *surface;
  void *__buf;
  Pipeline *pPVar4;
  Surface resultSurface;
  Surface refSurface;
  Surface pipelineSurface;
  ProgramParams programPp;
  ProgramParams pipePp;
  string local_168;
  string local_148;
  Surface local_128;
  Surface local_110;
  Surface local_f8;
  ProgramParams local_e0;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0 [6];
  ProgramParams local_40;
  
  rnd = &this->m_rnd;
  local_40 = genProgramParams(rnd);
  local_e0 = genProgramParams(rnd);
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)local_d0,this,&local_40);
  uVar2 = local_d0._0_8_;
  local_d0._0_8_ = (Pipeline *)0x0;
  pPVar4 = (pipeOut->
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           ).m_data.ptr;
  if (pPVar4 != (Pipeline *)uVar2) {
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ::reset(&pipeOut->
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           );
    (pipeOut->
    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ).m_data.ptr = (Pipeline *)uVar2;
    pPVar4 = (Pipeline *)uVar2;
  }
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *)local_d0);
  pipeline = ((pPVar4->pipeline).
              super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.
              m_data.ptr)->m_pipeline;
  createReferenceProgram
            ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_d0,this,&local_e0);
  uVar2 = local_d0._0_8_;
  tcu::Surface::Surface(&local_f8);
  tcu::Surface::Surface(&local_110);
  tcu::Surface::Surface(&local_128);
  seed = deRandom_getUint32(&rnd->m_rnd);
  this_00 = &this->super_CallLogWrapper;
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,pipeline);
  (this->super_CallLogWrapper).m_enableLog = false;
  drawSurface(this,&local_f8,seed);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = true;
  GVar3 = (**(code **)(*(long *)uVar2 + 0x10))(uVar2);
  glu::CallLogWrapper::glUseProgram(this_00,GVar3);
  (this->super_CallLogWrapper).m_enableLog = false;
  drawSurface(this,&local_110,seed);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = true;
  GVar3 = (**(code **)(*(long *)uVar2 + 0x10))(uVar2);
  glu::CallLogWrapper::glUseProgram(this_00,GVar3);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,pipeline);
  (this->super_CallLogWrapper).m_enableLog = false;
  drawSurface(this,&local_128,seed);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glBindProgramPipeline(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  (this->super_CallLogWrapper).m_enableLog = false;
  local_d0._0_8_ = local_d0._0_8_ & 0xffffffff00000000;
  condition = tcu::pixelThresholdCompare
                        (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                         "Active program rendering result","Active program rendering result",
                         &local_110,&local_128,(RGBA *)local_d0,COMPARE_LOG_RESULT);
  pPVar4 = (Pipeline *)(local_d0 + 0x10);
  local_d0._0_8_ = pPVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,"glBindProgramPipeline() affects glUseProgram()","");
  tcu::ResultCollector::check(&this->m_status,condition,(string *)local_d0);
  if ((Pipeline *)local_d0._0_8_ != pPVar4) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (!condition) {
    pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Pipeline image","");
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Image produced by pipeline","");
    surface = &local_f8;
    tcu::LogImage::LogImage
              ((LogImage *)local_d0,&local_148,&local_168,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_d0,(int)pTVar1,__buf,(size_t)surface);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != local_a0) {
      operator_delete(local_b0._M_p,local_a0[0]._M_allocated_capacity + 1);
    }
    if ((Pipeline *)local_d0._0_8_ != pPVar4) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::Surface::~Surface(&local_128);
  tcu::Surface::~Surface(&local_110);
  tcu::Surface::~Surface(&local_f8);
  (**(code **)(*(long *)uVar2 + 8))(uVar2);
  return;
}

Assistant:

void SeparateShaderTest::testCurrentProgPriority (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	ProgramParams				programPp	= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	UniquePtr<ProgramWrapper>	program		(createReferenceProgram(programPp));
	Surface						pipelineSurface;
	Surface						refSurface;
	Surface						resultSurface;
	deUint32					drawSeed	= m_rnd.getUint32();

	LOG_CALL(glBindProgramPipeline(pipeName));
	drawSurface(pipelineSurface, drawSeed);
	LOG_CALL(glBindProgramPipeline(0));

	LOG_CALL(glUseProgram(program->getProgramName()));
	drawSurface(refSurface, drawSeed);
	LOG_CALL(glUseProgram(0));

	LOG_CALL(glUseProgram(program->getProgramName()));
	LOG_CALL(glBindProgramPipeline(pipeName));
	drawSurface(resultSurface, drawSeed);
	LOG_CALL(glBindProgramPipeline(0));
	LOG_CALL(glUseProgram(0));

	bool result = tcu::pixelThresholdCompare(
		m_testCtx.getLog(), "Active program rendering result",
		"Active program rendering result",
		refSurface, resultSurface, tcu::RGBA(0, 0, 0, 0), tcu::COMPARE_LOG_RESULT);

	m_status.check(result, "glBindProgramPipeline() affects glUseProgram()");
	if (!result)
		log() << TestLog::Image("Pipeline image", "Image produced by pipeline",
								pipelineSurface);
}